

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall TiXmlElement::ClearThis(TiXmlElement *this)

{
  TiXmlAttributeSet *this_00;
  TiXmlNode *pTVar1;
  TiXmlBase *pTVar2;
  TiXmlAttribute *node;
  TiXmlAttribute *removeMe;
  
  pTVar1 = (this->super_TiXmlNode).firstChild;
  while (pTVar1 != (TiXmlNode *)0x0) {
    pTVar2 = &pTVar1->super_TiXmlBase;
    pTVar1 = pTVar1->next;
    (*pTVar2->_vptr_TiXmlBase[1])();
  }
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  this_00 = &this->attributeSet;
  removeMe = (this->attributeSet).sentinel.next;
  if (removeMe != (TiXmlAttribute *)0x0 && removeMe != &this_00->sentinel) {
    do {
      TiXmlAttributeSet::Remove(this_00,removeMe);
      (*(removeMe->super_TiXmlBase)._vptr_TiXmlBase[1])(removeMe);
      removeMe = (this->attributeSet).sentinel.next;
      if (removeMe == &this_00->sentinel) {
        return;
      }
    } while (removeMe != (TiXmlAttribute *)0x0);
  }
  return;
}

Assistant:

void TiXmlElement::ClearThis()
{
	Clear();
	while( attributeSet.First() )
	{
		TiXmlAttribute* node = attributeSet.First();
		attributeSet.Remove( node );
		delete node;
	}
}